

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

ModportClockingSymbol *
slang::ast::ModportClockingSymbol::fromSyntax(ASTContext *context,ModportClockingPortSyntax *syntax)

{
  Compilation *this;
  Scope *scope;
  undefined8 uVar1;
  undefined4 uVar2;
  ModportClockingSymbol *pMVar3;
  Symbol *pSVar4;
  Diagnostic *this_00;
  string_view sVar5;
  SourceRange SVar6;
  LookupLocation location;
  Token name;
  Token local_58;
  SourceLocation local_48;
  string_view local_40;
  
  this = ((context->scope).ptr)->compilation;
  local_58.kind = (syntax->name).kind;
  local_58._2_1_ = (syntax->name).field_0x2;
  local_58.numFlags.raw = (syntax->name).numFlags.raw;
  local_58.rawLen = (syntax->name).rawLen;
  local_58.info = (syntax->name).info;
  local_40 = parsing::Token::valueText(&local_58);
  local_48 = parsing::Token::location(&local_58);
  pMVar3 = BumpAllocator::
           emplace<slang::ast::ModportClockingSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&this->super_BumpAllocator,&local_40,&local_48);
  (pMVar3->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  scope = (context->scope).ptr;
  sVar5 = parsing::Token::valueText(&local_58);
  uVar1 = context->scope;
  uVar2 = context->lookupIndex;
  location.index = uVar2;
  location.scope = (Scope *)uVar1;
  SVar6 = parsing::Token::range(&local_58);
  location._12_4_ = 0;
  pSVar4 = Lookup::unqualifiedAt(scope,sVar5,location,SVar6,(bitmask<slang::ast::LookupFlags>)0x40);
  pMVar3->target = pSVar4;
  if ((pSVar4 != (Symbol *)0x0) && (pSVar4->kind != ClockingBlock)) {
    SVar6 = parsing::Token::range(&local_58);
    this_00 = ASTContext::addDiag(context,(DiagCode)0x8d0006,SVar6);
    sVar5 = parsing::Token::valueText(&local_58);
    Diagnostic::operator<<(this_00,sVar5);
    Diagnostic::addNote(this_00,(DiagCode)0x50001,pMVar3->target->location);
    pMVar3->target = (Symbol *)0x0;
  }
  return pMVar3;
}

Assistant:

ModportClockingSymbol& ModportClockingSymbol::fromSyntax(const ASTContext& context,
                                                         const ModportClockingPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportClockingSymbol>(name.valueText(), name.location());
    result->setSyntax(syntax);

    result->target = Lookup::unqualifiedAt(*context.scope, name.valueText(), context.getLocation(),
                                           name.range(), LookupFlags::NoParentScope);

    if (result->target && result->target->kind != SymbolKind::ClockingBlock) {
        auto& diag = context.addDiag(diag::NotAClockingBlock, name.range());
        diag << name.valueText();
        diag.addNote(diag::NoteDeclarationHere, result->target->location);
        result->target = nullptr;
    }

    return *result;
}